

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

bool despot::option::PrintUsageImplementation::isWideChar(uint ch)

{
  bool bVar1;
  
  if (ch == 0x303f) {
    bVar1 = false;
  }
  else {
    bVar1 = (0x1afff < ch || (ch - 0xffe0 < 7 || ch - 0xff01 < 0x60)) ||
            ((ch - 0xfe10 < 0x5c || (ch - 0xf900 < 0x200 || ch - 0xac00 < 0x2bfc)) ||
            ((ch - 0xa960 < 0x1d || ch - 0x2e80 < 0x7647) || (ch - 0x2329 < 2 || ch - 0x1100 < 0x60)
            ));
  }
  return bVar1;
}

Assistant:

static bool isWideChar(unsigned ch) {
		if (ch == 0x303F)
			return false;

		return ((0x1100 <= ch && ch <= 0x115F) || (0x2329 <= ch && ch <= 0x232A)
			|| (0x2E80 <= ch && ch <= 0xA4C6) || (0xA960 <= ch && ch <= 0xA97C)
			|| (0xAC00 <= ch && ch <= 0xD7FB) || (0xF900 <= ch && ch <= 0xFAFF)
			|| (0xFE10 <= ch && ch <= 0xFE6B) || (0xFF01 <= ch && ch <= 0xFF60)
			|| (0xFFE0 <= ch && ch <= 0xFFE6) || (0x1B000 <= ch));
	}